

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>>
               (ArgMinMaxState<duckdb::hugeint_t,_double> *state,hugeint_t x_data,double y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  ArgMinMaxState<duckdb::hugeint_t,_double> *in_RSI;
  hugeint_t *in_RDI;
  double *in_XMM0_Qa;
  double *in_stack_ffffffffffffffc8;
  double *in_stack_ffffffffffffffd0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RCX,(idx_t)in_stack_ffffffffffffffd0);
  if ((bVar1) &&
     (bVar1 = LessThan::Operation<double>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
     bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RCX,(idx_t)in_RDI);
    Assign<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>>
              (in_RSI,in_RDI,in_XMM0_Qa,SUB81((ulong)in_RCX >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}